

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::CreateEvaluationFileOutputs(cmLocalGenerator *this,string *config)

{
  pointer ppcVar1;
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ef;
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  local_38;
  
  cmMakefile::GetEvaluationFiles(&local_38,this->Makefile);
  ppcVar1 = local_38.
            super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_38.
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmGeneratorExpressionEvaluationFile::CreateOutputFile(*ppcVar1,this,config);
      ppcVar1 = ppcVar1 + 1;
    } while (ppcVar1 !=
             local_38.
             super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_38.
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLocalGenerator::CreateEvaluationFileOutputs(std::string const& config)
{
  std::vector<cmGeneratorExpressionEvaluationFile*> ef =
    this->Makefile->GetEvaluationFiles();
  for (std::vector<cmGeneratorExpressionEvaluationFile*>::const_iterator li =
         ef.begin();
       li != ef.end(); ++li) {
    (*li)->CreateOutputFile(this, config);
  }
}